

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SelfTestData::MergeFrom(SelfTestData *this,SelfTestData *from)

{
  LogMessage *other;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  InternalMetadata *this_00;
  LogFinisher local_ad;
  uint32 cached_has_bits;
  byte local_99;
  LogMessage local_98;
  SelfTestData *local_60;
  SelfTestData *from_local;
  SelfTestData *this_local;
  InternalMetadata *local_48;
  InternalMetadata *local_40;
  undefined8 local_38;
  InternalMetadata *local_30;
  string *local_28;
  InternalMetadata *local_20;
  InternalMetadata *local_18;
  InternalMetadata *local_10;
  
  local_99 = 0;
  local_60 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0xaac);
    local_99 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_98,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_ad,other);
  }
  if ((local_99 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_60->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  this_local = (SelfTestData *)&(local_60->super_MessageLite)._internal_metadata_;
  local_48 = this_00;
  local_40 = (InternalMetadata *)this_local;
  local_10 = (InternalMetadata *)this_local;
  if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
    local_38 = 0;
    local_30 = (InternalMetadata *)this_local;
    local_20 = (InternalMetadata *)this_local;
    local_18 = (InternalMetadata *)this_local;
    if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
      pCVar1 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         ((InternalMetadata *)this_local);
      local_28 = &pCVar1->unknown_fields;
    }
    else {
      local_28 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,local_28);
  }
  google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::MergeFrom
            (&this->samples_,&local_60->samples_);
  return;
}

Assistant:

void SelfTestData::MergeFrom(const SelfTestData& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SelfTestData)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  samples_.MergeFrom(from.samples_);
}